

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Skip(SequentialFileImpl *this,uint64_t n)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong in_RDX;
  long in_FS_OFFSET;
  Slice local_48;
  Slice local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(ulong *)(n + 0x10);
  uVar1 = FileState::Size(*(FileState **)(n + 8));
  if (uVar1 < uVar2) {
    local_38.data_ = "pos_ > file_->Size()";
    local_38.size_ = 0x14;
    local_48.data_ = "";
    local_48.size_ = 0;
    Status::IOError((Status *)this,&local_38,&local_48);
  }
  else {
    uVar1 = FileState::Size(*(FileState **)(n + 8));
    uVar2 = uVar1 - *(long *)(n + 0x10);
    if (in_RDX <= uVar2) {
      uVar2 = in_RDX;
    }
    *(ulong *)(n + 0x10) = uVar2 + *(long *)(n + 0x10);
    (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Skip(uint64_t n) override {
    if (pos_ > file_->Size()) {
      return Status::IOError("pos_ > file_->Size()");
    }
    const uint64_t available = file_->Size() - pos_;
    if (n > available) {
      n = available;
    }
    pos_ += n;
    return Status::OK();
  }